

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManAddCube1(int nRowLimit,word *Cover,int nRows,word Cube)

{
  int local_30;
  int local_2c;
  int m;
  int n;
  word Cube_local;
  int nRows_local;
  word *Cover_local;
  int nRowLimit_local;
  
  if (nRowLimit < nRows) {
    __assert_fail("nRows <= nRowLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x353,"int Sbd_ManAddCube1(int, word *, int, word)");
  }
  local_2c = 0;
  while( true ) {
    if (nRows <= local_2c) {
      local_30 = 0;
      for (local_2c = 0; local_2c < nRows; local_2c = local_2c + 1) {
        if ((Cover[local_2c] & Cube) != Cube) {
          Cover[local_30] = Cover[local_2c];
          local_30 = local_30 + 1;
        }
      }
      if (local_30 < nRowLimit) {
        Cover[local_30] = Cube;
        local_30 = local_30 + 1;
      }
      for (local_2c = local_30; local_2c < nRows; local_2c = local_2c + 1) {
        Cover[local_2c] = 0;
      }
      return local_30;
    }
    if ((Cover[local_2c] & Cube) == Cover[local_2c]) break;
    local_2c = local_2c + 1;
  }
  return nRows;
}

Assistant:

static inline int Sbd_ManAddCube1( int nRowLimit, word Cover[], int nRows, word Cube )
{
    int n, m;
    if ( 0 )
    {
        printf( "Adding cube: " );
        for ( n = 0; n < nRowLimit; n++ )
            printf( "%d", (int)((Cube >> n) & 1) );
        printf( "\n" );
    }
    // do not add contained Cube
    assert( nRows <= nRowLimit );
    for ( n = 0; n < nRows; n++ )
        if ( (Cover[n] & Cube) == Cover[n] ) // Cube is contained
            return nRows;
    // remove rows contained by Cube
    for ( n = m = 0; n < nRows; n++ )
        if ( (Cover[n] & Cube) != Cube ) // Cover[n] is not contained
            Cover[m++] = Cover[n];
    if ( m < nRowLimit )
        Cover[m++] = Cube;
    for ( n = m; n < nRows; n++ )
        Cover[n] = 0;
    nRows = m;
    return nRows;
}